

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O3

TPZCompEl * __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_>::Clone
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_> *this,TPZCompMesh *mesh)

{
  TPZCompElH1<pzshape::TPZShapePiram> *this_00;
  
  this_00 = (TPZCompElH1<pzshape::TPZShapePiram> *)operator_new(0x110);
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapePiram>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0197b690;
  TPZCompElH1<pzshape::TPZShapePiram>::TPZCompElH1
            (this_00,&PTR_PTR_019725c0,mesh,&this->super_TPZCompElH1<pzshape::TPZShapePiram>);
  *(undefined8 *)
   &this_00[1].super_TPZIntelGen<pzshape::TPZShapePiram>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = 0;
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapePiram>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_019721f0;
  return (TPZCompEl *)this_00;
}

Assistant:

inline TPZCompEl * TPZCompElPostProc<TCOMPEL>::Clone(TPZCompMesh &mesh) const{
    return new TPZCompElPostProc<TCOMPEL> (mesh, *this);
}